

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_stop_seqimap(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  char msg [34];
  char local_38 [48];
  
  if ((this->m_state->flags & 0x2000) == 0) {
    builtin_strncpy(local_38,"check failed: (has_all(RSEQIMAP))",0x22);
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x78ee) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x78ee) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_38,0x22,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  return;
}

Assistant:

inline bool has_all(flag_t f) const { return (m_state->flags & f) == f; }